

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void __thiscall
pbrt::KdTreeAggregate::buildTree
          (KdTreeAggregate *this,int nodeNum,Bounds3f *nodeBounds,
          vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *allPrimBounds,
          span<const_int> primNums,int depth,
          vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *edges,span<int> prims0,
          span<int> prims1,int badRefines)

{
  span<int> prims0_00;
  Point3<float> p;
  span<const_int> primNums_00;
  span<const_int> primNums_01;
  span<const_int> primNums_02;
  span<const_int> primNums_03;
  int *piVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  reference pvVar5;
  float *pfVar6;
  Bounds3f *in_RCX;
  Tuple3<pbrt::Point3,_float> *in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_R8;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  Vector3<float> VVar13;
  span<int> sVar14;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int *in_stack_00000010;
  span<int> *in_stack_00000018;
  undefined8 uStack0000000000000020;
  int in_stack_00000030;
  int in_stack_00000038;
  int aboveChild;
  Bounds3f bounds1;
  Bounds3f bounds0;
  Float tSplit;
  int i_3;
  int i_2;
  int n1;
  int n0;
  Float cost;
  Float eb;
  Float pAbove;
  Float pBelow;
  Float aboveSA;
  Float belowSA;
  int otherAxis1;
  int otherAxis0;
  Vector3f d;
  Float edgeT;
  size_t i_1;
  int nAbove;
  int nBelow;
  Bounds3f *bounds;
  int pn;
  size_t i;
  size_t nPrimitives;
  int retries;
  int axis;
  Float invTotalSA;
  Float leafCost;
  Float bestCost;
  int bestOffset;
  int bestAxis;
  KdTreeNode *n;
  int nNewAllocNodes;
  int vb;
  int va;
  vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *in_stack_fffffffffffffd08;
  difference_type in_stack_fffffffffffffd10;
  span<int> *in_stack_fffffffffffffd18;
  span<int> *v;
  Bounds3<float> *in_stack_fffffffffffffd20;
  span<const_int> *this_00;
  Bounds3<float> *in_stack_fffffffffffffd28;
  span<int> *in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  Float FVar15;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  char (*in_stack_fffffffffffffd58) [13];
  undefined4 in_stack_fffffffffffffd60;
  int iVar16;
  int in_stack_fffffffffffffd64;
  float in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  float in_stack_fffffffffffffd74;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  LogLevel in_stack_fffffffffffffd84;
  float fVar17;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int *in_stack_fffffffffffffd98;
  char (*in_stack_fffffffffffffda0) [13];
  int *in_stack_fffffffffffffda8;
  int *local_1f0;
  span<int> *local_1e8;
  undefined1 local_1ac [16];
  undefined8 local_19c;
  undefined8 local_194;
  undefined1 local_18c [8];
  undefined8 local_184;
  Float local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  int local_140;
  int local_13c;
  Tuple3<pbrt::Vector3,_float> local_138;
  undefined8 local_128;
  float local_120;
  undefined8 local_118;
  float local_110;
  Tuple3<pbrt::Vector3,_float> local_108;
  Float local_fc;
  ulong local_f8;
  int local_ec;
  int local_e8;
  BoundEdge *local_e0;
  BoundEdge *local_d8;
  BoundEdge *local_d0;
  BoundEdge local_c8;
  BoundEdge local_bc;
  const_reference local_b0;
  int local_a4;
  size_t local_a0;
  size_t local_98;
  int local_8c;
  int local_88;
  float local_84;
  float local_80;
  float local_7c;
  int local_78;
  int local_74;
  void *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int iVar18;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar19;
  int *piVar20;
  
  iVar18 = in_RDI[0x13];
  if (in_ESI != iVar18) {
    LogFatal<char_const(&)[8],char_const(&)[13],char_const(&)[8],int&,char_const(&)[13],int&>
              (in_stack_fffffffffffffd84,
               (char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               (int)in_stack_fffffffffffffd74,
               (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (char (*) [8])CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd58,
               (char (*) [8])CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd98,in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
  }
  iVar19 = in_ESI;
  piVar20 = in_RDI;
  if (in_RDI[0x13] == in_RDI[0x12]) {
    local_50 = in_RDI[0x12] << 1;
    local_54 = 0x200;
    piVar1 = std::max<int>(&local_50,&local_54);
    local_4c = *piVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)local_4c;
    uVar2 = SUB168(auVar10 * ZEXT816(8),0);
    if (SUB168(auVar10 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_60 = operator_new__(uVar2);
    if (0 < in_RDI[0x12]) {
      memcpy(local_60,*(void **)(in_RDI + 0x10),(long)in_RDI[0x12] << 3);
      if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x10));
      }
    }
    *(void **)(in_RDI + 0x10) = local_60;
    in_RDI[0x12] = local_4c;
  }
  in_RDI[0x13] = in_RDI[0x13] + 1;
  sVar3 = pstd::span<const_int>::size((span<const_int> *)&stack0xffffffffffffffe0);
  if (((ulong)(long)in_RDI[2] < sVar3) && (in_stack_00000008 != 0)) {
    local_74 = -1;
    local_78 = -1;
    auVar10 = SUB6416(ZEXT464(0x7f800000),0);
    local_7c = INFINITY;
    lVar4 = (long)*in_RDI;
    sVar3 = pstd::span<const_int>::size((span<const_int> *)&stack0xffffffffffffffe0);
    auVar10 = vcvtusi2ss_avx512f(auVar10,lVar4 * sVar3);
    local_80 = auVar10._0_4_;
    local_84 = Bounds3<float>::SurfaceArea(in_stack_fffffffffffffd20);
    local_84 = 1.0 / local_84;
    local_88 = Bounds3<float>::MaxDimension(in_stack_fffffffffffffd28);
    local_8c = 0;
    local_98 = pstd::span<const_int>::size((span<const_int> *)&stack0xffffffffffffffe0);
    while( true ) {
      for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
        piVar1 = pstd::span<const_int>::operator[]
                           ((span<const_int> *)&stack0xffffffffffffffe0,local_a0);
        local_a4 = *piVar1;
        local_b0 = std::vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>::
                   operator[]((vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_>
                               *)in_RCX,(long)local_a4);
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[]
                          ((Tuple3<pbrt::Point3,_float> *)local_b0,local_88);
        BoundEdge::BoundEdge(&local_bc,fVar7,local_a4,true);
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_88 * 6),local_a0 << 1);
        pvVar5->t = local_bc.t;
        pvVar5->primNum = local_bc.primNum;
        pvVar5->type = local_bc.type;
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[]
                          (&(local_b0->pMax).super_Tuple3<pbrt::Point3,_float>,local_88);
        BoundEdge::BoundEdge(&local_c8,fVar7,local_a4,false);
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_88 * 6),local_a0 * 2 + 1);
        pvVar5->t = local_c8.t;
        pvVar5->primNum = local_c8.primNum;
        pvVar5->type = local_c8.type;
      }
      local_d0 = (BoundEdge *)
                 std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::begin
                           (in_stack_fffffffffffffd08);
      local_e0 = (BoundEdge *)
                 std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::begin
                           (in_stack_fffffffffffffd08);
      local_d8 = (BoundEdge *)
                 __gnu_cxx::
                 __normal_iterator<pbrt::BoundEdge_*,_std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>_>
                 ::operator+((__normal_iterator<pbrt::BoundEdge_*,_std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>_>
                              *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::
      sort<__gnu_cxx::__normal_iterator<pbrt::BoundEdge*,std::vector<pbrt::BoundEdge,std::allocator<pbrt::BoundEdge>>>,pbrt::KdTreeAggregate::buildTree(int,pbrt::Bounds3<float>const&,std::vector<pbrt::Bounds3<float>,std::allocator<pbrt::Bounds3<float>>>const&,pstd::span<int_const>,int,std::vector<pbrt::BoundEdge,std::allocator<pbrt::BoundEdge>>*,pstd::span<int>,pstd::span<int>,int)::__0>
                (local_d0,local_d8);
      local_e8 = 0;
      sVar3 = pstd::span<const_int>::size((span<const_int> *)&stack0xffffffffffffffe0);
      local_ec = (int)sVar3;
      local_f8 = 0;
      while (uVar2 = local_f8,
            sVar3 = pstd::span<const_int>::size((span<const_int> *)&stack0xffffffffffffffe0),
            uVar2 < sVar3 << 1) {
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_88 * 6),local_f8);
        if (pvVar5->type == End) {
          local_ec = local_ec + -1;
        }
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_88 * 6),local_f8);
        FVar15 = pvVar5->t;
        local_fc = FVar15;
        fVar7 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX,local_88);
        if ((fVar7 < FVar15) &&
           (FVar15 = local_fc, fVar7 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX + 1,local_88),
           FVar15 < fVar7)) {
          local_120 = in_RDX->z;
          local_128._0_4_ = in_RDX->x;
          local_128._4_4_ = in_RDX->y;
          auVar12 = ZEXT856(0);
          p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd38;
          p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffffd30;
          local_118 = local_128;
          local_110 = local_120;
          VVar13 = Point3<float>::operator-((Point3<float> *)in_stack_fffffffffffffd18,p);
          local_138.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar11._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar11._8_56_ = auVar12;
          local_138._0_8_ = vmovlpd_avx(auVar11._0_16_);
          local_13c = (local_88 + 1) % 3;
          local_140 = (local_88 + 2) % 3;
          local_108._0_8_ = local_138._0_8_;
          local_108.z = local_138.z;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_13c);
          in_stack_fffffffffffffd6c = *pfVar6;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_140);
          FVar15 = local_fc;
          fVar7 = in_stack_fffffffffffffd6c * *pfVar6;
          fVar8 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX,local_88);
          fVar8 = FVar15 - fVar8;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_13c);
          in_stack_fffffffffffffd74 = *pfVar6;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_140);
          local_144 = (fVar7 + fVar8 * (in_stack_fffffffffffffd74 + *pfVar6)) * 2.0;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_13c);
          fVar7 = *pfVar6;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_140);
          fVar8 = *pfVar6;
          fVar9 = Tuple3<pbrt::Point3,_float>::operator[](in_RDX + 1,local_88);
          fVar9 = fVar9 - local_fc;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_13c);
          fVar17 = *pfVar6;
          pfVar6 = Tuple3<pbrt::Vector3,_float>::operator[](&local_108,local_140);
          local_148 = (fVar7 * fVar8 + fVar9 * (fVar17 + *pfVar6)) * 2.0;
          local_14c = local_144 * local_84;
          local_150 = local_148 * local_84;
          if ((local_ec == 0) || (local_e8 == 0)) {
            in_stack_fffffffffffffd68 = (float)in_RDI[3];
          }
          else {
            in_stack_fffffffffffffd68 = 0.0;
          }
          local_158 = (float)in_RDI[1] +
                      (float)*in_RDI * (1.0 - in_stack_fffffffffffffd68) *
                      (local_14c * (float)local_e8 + local_150 * (float)local_ec);
          local_154 = in_stack_fffffffffffffd68;
          if (local_158 < local_7c) {
            local_74 = local_88;
            local_78 = (int)local_f8;
            local_7c = local_158;
          }
        }
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_88 * 6),local_f8);
        if (pvVar5->type == Start) {
          local_e8 = local_e8 + 1;
        }
        local_f8 = local_f8 + 1;
      }
      if (((long)local_e8 != local_98) || (local_ec != 0)) {
        LogFatal<char_const(&)[37]>
                  ((LogLevel)in_stack_fffffffffffffd74,
                   (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                   in_stack_fffffffffffffd64,*in_stack_fffffffffffffd58,
                   (char (*) [37])CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      }
      if ((local_74 != -1) || (1 < local_8c)) break;
      local_8c = local_8c + 1;
      local_88 = (local_88 + 1) % 3;
    }
    if (local_80 < local_7c) {
      in_stack_00000038 = in_stack_00000038 + 1;
    }
    if ((((local_80 * 4.0 < local_7c) && (local_98 < 0x10)) || (local_74 == -1)) ||
       (in_stack_00000038 == 3)) {
      primNums_01.ptr._4_4_ = in_stack_fffffffffffffd3c;
      primNums_01.ptr._0_4_ = in_stack_fffffffffffffd38;
      primNums_01.n._0_4_ = in_stack_fffffffffffffd40;
      primNums_01.n._4_4_ = in_stack_fffffffffffffd44;
      KdTreeNode::InitLeaf
                ((KdTreeNode *)in_stack_fffffffffffffd30,primNums_01,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
    }
    else {
      local_16c = 0;
      local_170 = 0;
      for (local_174 = 0; local_178 = local_78, local_174 < local_78; local_174 = local_174 + 1) {
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_74 * 6),(long)local_174);
        if (pvVar5->type == Start) {
          pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                             ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                              (in_stack_00000010 + (long)local_74 * 6),(long)local_174);
          iVar16 = pvVar5->primNum;
          sVar3 = (size_t)local_16c;
          local_16c = local_16c + 1;
          piVar1 = pstd::span<int>::operator[]((span<int> *)&stack0x00000018,sVar3);
          *piVar1 = iVar16;
        }
      }
      while (local_178 = local_178 + 1, (ulong)(long)local_178 < local_98 << 1) {
        pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                           ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                            (in_stack_00000010 + (long)local_74 * 6),(long)local_178);
        if (pvVar5->type == End) {
          pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                             ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                              (in_stack_00000010 + (long)local_74 * 6),(long)local_178);
          iVar16 = pvVar5->primNum;
          sVar3 = (size_t)local_170;
          local_170 = local_170 + 1;
          piVar1 = pstd::span<int>::operator[]((span<int> *)((long)&stack0x00000020 + 8),sVar3);
          *piVar1 = iVar16;
        }
      }
      pvVar5 = std::vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_>::operator[]
                         ((vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                          (in_stack_00000010 + (long)local_74 * 6),(long)local_78);
      FVar15 = pvVar5->t;
      local_194._0_4_ = in_RDX->x;
      local_194._4_4_ = in_RDX->y;
      local_18c = *(undefined1 (*) [8])&in_RDX->z;
      local_184._0_4_ = in_RDX[1].y;
      local_184._4_4_ = in_RDX[1].z;
      local_1ac._0_4_ = in_RDX->x;
      local_1ac._4_4_ = in_RDX->y;
      local_1ac._8_8_ = *(undefined8 *)&in_RDX->z;
      local_19c._0_4_ = in_RDX[1].y;
      local_19c._4_4_ = in_RDX[1].z;
      local_17c = FVar15;
      pfVar6 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)local_1ac,local_74);
      iVar16 = (int)((ulong)in_RDX >> 0x20);
      *pfVar6 = FVar15;
      pfVar6 = Tuple3<pbrt::Point3,_float>::operator[]
                         ((Tuple3<pbrt::Point3,_float> *)(local_18c + 4),local_74);
      *pfVar6 = FVar15;
      pstd::span<int>::subspan
                (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                 (size_t)in_stack_fffffffffffffd20);
      pstd::span<int_const>::span<pstd::span<int>,void,pstd::span<int>>
                ((span<const_int> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      v = in_stack_00000018;
      this_00 = (span<const_int> *)uStack0000000000000020;
      sVar14 = pstd::span<int>::subspan
                         (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
                          (size_t)in_stack_fffffffffffffd20);
      local_1f0 = sVar14.ptr;
      local_1e8 = (span<int> *)sVar14.n;
      primNums_02.n = (size_t)in_R8;
      primNums_02.ptr = piVar20;
      sVar14.n = (size_t)in_stack_00000018;
      sVar14.ptr = in_stack_00000010;
      buildTree((KdTreeAggregate *)CONCAT44(iVar19,in_stack_ffffffffffffffd0),iVar16,in_RCX,
                (vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *)
                CONCAT44(in_ESI,iVar18),primNums_02,unaff_retaddr,
                (vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                CONCAT44(in_stack_0000000c,in_stack_00000008),sVar14,
                (span<int>)_uStack0000000000000020,in_stack_00000030);
      KdTreeNode::InitInterior
                ((KdTreeNode *)(*(long *)(in_RDI + 0x10) + (long)iVar19 * 8),local_74,in_RDI[0x13],
                 local_17c);
      pstd::span<int>::subspan(local_1e8,(size_t)local_1f0,(size_t)this_00);
      pstd::span<int_const>::span<pstd::span<int>,void,pstd::span<int>>(this_00,v);
      pstd::span<int>::subspan(local_1e8,(size_t)local_1f0,(size_t)this_00);
      primNums_03.n = (size_t)in_R8;
      primNums_03.ptr = piVar20;
      prims0_00.n = (size_t)in_stack_00000018;
      prims0_00.ptr = in_stack_00000010;
      buildTree((KdTreeAggregate *)CONCAT44(iVar19,in_stack_ffffffffffffffd0),iVar16,in_RCX,
                (vector<pbrt::Bounds3<float>,_std::allocator<pbrt::Bounds3<float>_>_> *)
                CONCAT44(in_ESI,iVar18),primNums_03,unaff_retaddr,
                (vector<pbrt::BoundEdge,_std::allocator<pbrt::BoundEdge>_> *)
                CONCAT44(in_stack_0000000c,in_stack_00000008),prims0_00,
                (span<int>)_uStack0000000000000020,in_stack_00000030);
    }
  }
  else {
    primNums_00.ptr._4_4_ = in_stack_fffffffffffffd3c;
    primNums_00.ptr._0_4_ = in_stack_fffffffffffffd38;
    primNums_00.n._0_4_ = in_stack_fffffffffffffd40;
    primNums_00.n._4_4_ = in_stack_fffffffffffffd44;
    KdTreeNode::InitLeaf
              ((KdTreeNode *)in_stack_fffffffffffffd30,primNums_00,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd28);
  }
  return;
}

Assistant:

void KdTreeAggregate::buildTree(int nodeNum, const Bounds3f &nodeBounds,
                                const std::vector<Bounds3f> &allPrimBounds,
                                pstd::span<const int> primNums, int depth,
                                std::vector<BoundEdge> edges[3], pstd::span<int> prims0,
                                pstd::span<int> prims1, int badRefines) {
    CHECK_EQ(nodeNum, nextFreeNode);
    // Get next free node from _nodes_ array
    if (nextFreeNode == nAllocedNodes) {
        int nNewAllocNodes = std::max(2 * nAllocedNodes, 512);
        KdTreeNode *n = new KdTreeNode[nNewAllocNodes];
        if (nAllocedNodes > 0) {
            std::memcpy(n, nodes, nAllocedNodes * sizeof(KdTreeNode));
            delete[] nodes;
        }
        nodes = n;
        nAllocedNodes = nNewAllocNodes;
    }
    ++nextFreeNode;

    // Initialize leaf node if termination criteria met
    if (primNums.size() <= maxPrims || depth == 0) {
        nodes[nodeNum].InitLeaf(primNums, &primitiveIndices);
        return;
    }

    // Initialize interior node and continue recursion
    // Choose split axis position for interior node
    int bestAxis = -1, bestOffset = -1;
    Float bestCost = Infinity, leafCost = isectCost * primNums.size();
    Float invTotalSA = 1 / nodeBounds.SurfaceArea();
    // Choose which axis to split along
    int axis = nodeBounds.MaxDimension();

    // Choose split along axis and attempt to partition primitives
    int retries = 0;
    size_t nPrimitives = primNums.size();
retrySplit:
    // Initialize edges for _axis_
    for (size_t i = 0; i < nPrimitives; ++i) {
        int pn = primNums[i];
        const Bounds3f &bounds = allPrimBounds[pn];
        edges[axis][2 * i] = BoundEdge(bounds.pMin[axis], pn, true);
        edges[axis][2 * i + 1] = BoundEdge(bounds.pMax[axis], pn, false);
    }
    // Sort _edges_ for _axis_
    std::sort(edges[axis].begin(), edges[axis].begin() + 2 * nPrimitives,
              [](const BoundEdge &e0, const BoundEdge &e1) -> bool {
                  return std::tie(e0.t, e0.type) < std::tie(e1.t, e1.type);
              });

    // Compute cost of all splits for _axis_ to find best
    int nBelow = 0, nAbove = primNums.size();
    for (size_t i = 0; i < 2 * primNums.size(); ++i) {
        if (edges[axis][i].type == EdgeType::End)
            --nAbove;
        Float edgeT = edges[axis][i].t;
        if (edgeT > nodeBounds.pMin[axis] && edgeT < nodeBounds.pMax[axis]) {
            // Compute child surface areas for split at _edgeT_
            Vector3f d = nodeBounds.pMax - nodeBounds.pMin;
            int otherAxis0 = (axis + 1) % 3, otherAxis1 = (axis + 2) % 3;
            Float belowSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (edgeT - nodeBounds.pMin[axis]) * (d[otherAxis0] + d[otherAxis1]));
            Float aboveSA =
                2 * (d[otherAxis0] * d[otherAxis1] +
                     (nodeBounds.pMax[axis] - edgeT) * (d[otherAxis0] + d[otherAxis1]));

            // Compute cost for split at _i_th edge
            Float pBelow = belowSA * invTotalSA, pAbove = aboveSA * invTotalSA;
            Float eb = (nAbove == 0 || nBelow == 0) ? emptyBonus : 0;
            Float cost = traversalCost +
                         isectCost * (1 - eb) * (pBelow * nBelow + pAbove * nAbove);
            // Update best split if this is lowest cost so far
            if (cost < bestCost) {
                bestCost = cost;
                bestAxis = axis;
                bestOffset = i;
            }
        }
        if (edges[axis][i].type == EdgeType::Start)
            ++nBelow;
    }
    CHECK(nBelow == nPrimitives && nAbove == 0);

    // Try to split along another axis if no good splits were found
    if (bestAxis == -1 && retries < 2) {
        ++retries;
        axis = (axis + 1) % 3;
        goto retrySplit;
    }

    // Create leaf if no good splits were found
    if (bestCost > leafCost)
        ++badRefines;
    if ((bestCost > 4 * leafCost && nPrimitives < 16) || bestAxis == -1 ||
        badRefines == 3) {
        nodes[nodeNum].InitLeaf(primNums, &primitiveIndices);
        return;
    }

    // Classify primitives with respect to split
    int n0 = 0, n1 = 0;
    for (int i = 0; i < bestOffset; ++i)
        if (edges[bestAxis][i].type == EdgeType::Start)
            prims0[n0++] = edges[bestAxis][i].primNum;
    for (int i = bestOffset + 1; i < 2 * nPrimitives; ++i)
        if (edges[bestAxis][i].type == EdgeType::End)
            prims1[n1++] = edges[bestAxis][i].primNum;

    // Recursively initialize kd-tree node's children
    Float tSplit = edges[bestAxis][bestOffset].t;
    Bounds3f bounds0 = nodeBounds, bounds1 = nodeBounds;
    bounds0.pMax[bestAxis] = bounds1.pMin[bestAxis] = tSplit;
    buildTree(nodeNum + 1, bounds0, allPrimBounds, prims0.subspan(0, n0), depth - 1,
              edges, prims0, prims1.subspan(n1), badRefines);
    int aboveChild = nextFreeNode;
    nodes[nodeNum].InitInterior(bestAxis, aboveChild, tSplit);
    buildTree(aboveChild, bounds1, allPrimBounds, prims1.subspan(0, n1), depth - 1, edges,
              prims0, prims1.subspan(n1), badRefines);
}